

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteResult.h
# Opt level: O2

void __thiscall
oout::SuiteResult::SuiteResult<oout::SuccessResult,oout::FailureResult,oout::SuccessResult>
          (SuiteResult *this,shared_ptr<oout::SuccessResult> *tests,
          shared_ptr<oout::FailureResult> *tests_1,shared_ptr<oout::SuccessResult> *tests_2)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_oout::Result>_> __l;
  allocator_type local_69;
  _List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50 [2];
  __shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> local_40 [16];
  __shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> local_30 [16];
  
  std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::SuccessResult,void>
            ((__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> *)local_50,
             &tests->super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::FailureResult,void>
            (local_40,&tests_1->super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>)
  ;
  std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::SuccessResult,void>
            (local_30,&tests_2->super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>)
  ;
  __l._M_len = 3;
  __l._M_array = (iterator)local_50;
  std::__cxx11::
  list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>::
  list((list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
        *)&local_68,__l,&local_69);
  SuiteResult(this,(list<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
                    *)&local_68);
  std::__cxx11::
  _List_base<std::shared_ptr<const_oout::Result>,_std::allocator<std::shared_ptr<const_oout::Result>_>_>
  ::_M_clear(&local_68);
  lVar1 = 0x28;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_50[0]._M_pi + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  return;
}

Assistant:

explicit SuiteResult(const std::shared_ptr<T> & ... tests)
		: SuiteResult(std::list<std::shared_ptr<const Result>>{
			tests...
		})
	{
	}